

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O2

void Acec_InsertFadd(Gia_Man_t *pNew,int *In,int *Out)

{
  int iVar1;
  int Out2 [2];
  int Out1 [2];
  int In2 [2];
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  Acec_InsertHadd(pNew,In,&local_30);
  local_28 = local_30;
  local_24 = In[2];
  Acec_InsertHadd(pNew,&local_28,&local_38);
  *Out = local_38;
  iVar1 = Gia_ManAppendOr2(pNew,local_2c,local_34);
  Out[1] = iVar1;
  return;
}

Assistant:

void Acec_InsertFadd( Gia_Man_t * pNew, int In[3], int Out[2] )
{
    int In2[2], Out1[2], Out2[2];
    Acec_InsertHadd( pNew, In, Out1 );
    In2[0] = Out1[0];
    In2[1] = In[2];
    Acec_InsertHadd( pNew, In2, Out2 );
    Out[0] = Out2[0];
    Out[1] = Gia_ManAppendOr2( pNew, Out1[1], Out2[1] );
}